

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O0

ChainstateManager * GetChainman(any *context,HTTPRequest *req)

{
  long lVar1;
  bool bVar2;
  NodeContext *args_2;
  int *in_RSI;
  char (*in_RDI) [89];
  long in_FS_OFFSET;
  NodeContext *node_context;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  any *in_stack_ffffffffffffff88;
  char (*in_stack_ffffffffffffffa8) [42];
  char *in_stack_ffffffffffffffc8;
  pointer pCVar3;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar4;
  HTTPStatusCode in_stack_ffffffffffffffdc;
  HTTPRequest *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  args_2 = util::AnyPtr<node::NodeContext>(in_stack_ffffffffffffff88);
  if (args_2 != (NodeContext *)0x0) {
    bVar2 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
                       in_stack_ffffffffffffff78);
    if (bVar2) {
      pCVar3 = std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::get
                         ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
                          in_stack_ffffffffffffff78);
      goto LAB_0126292d;
    }
  }
  uVar4 = 0x83;
  tinyformat::format<char[89],int,char[12],char[42]>
            (in_stack_ffffffffffffffc8,in_RDI,in_RSI,(char (*) [12])args_2,in_stack_ffffffffffffffa8
            );
  RESTERR(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
          (string *)CONCAT44(uVar4,in_stack_ffffffffffffffd0));
  std::__cxx11::string::~string(in_stack_ffffffffffffff78);
  pCVar3 = (pointer)0x0;
LAB_0126292d:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pCVar3;
  }
  __stack_chk_fail();
}

Assistant:

static ChainstateManager* GetChainman(const std::any& context, HTTPRequest* req)
{
    auto node_context = util::AnyPtr<NodeContext>(context);
    if (!node_context || !node_context->chainman) {
        RESTERR(req, HTTP_INTERNAL_SERVER_ERROR,
                strprintf("%s:%d (%s)\n"
                          "Internal bug detected: Chainman disabled or instance not found!\n"
                          "You may report this issue here: %s\n",
                          __FILE__, __LINE__, __func__, PACKAGE_BUGREPORT));
        return nullptr;
    }
    return node_context->chainman.get();
}